

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::socket_acceptor(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
                  *this,service *srv,string *path,int backlog)

{
  io_service *piVar1;
  char *__name;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  endpoint ep;
  endpoint local_38 [40];
  undefined8 local_10;
  
  local_10 = in_RSI;
  acceptor::acceptor((acceptor *)in_RDX);
  *in_RDI = &PTR_async_accept_005309b8;
  in_RDI[1] = local_10;
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x4941b5);
  piVar1 = cppcms::service::get_io_service((service *)0x4941cf);
  booster::aio::acceptor::acceptor((acceptor *)(in_RDI + 5),piVar1);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0x59) = 0;
  booster::aio::endpoint::endpoint(local_38,in_RDX);
  booster::aio::acceptor::open(in_RDI + 5,0);
  booster::aio::basic_socket::set_option(in_RDI + 5,2,1);
  __name = (char *)std::__cxx11::string::c_str();
  unlink(__name);
  booster::aio::acceptor::bind((endpoint *)(in_RDI + 5));
  booster::aio::acceptor::listen((int)in_RDI + 0x28);
  booster::aio::endpoint::~endpoint(local_38);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,std::string path,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(false)
			{
				io::endpoint ep(path);
				acceptor_.open(io::pf_unix);
				acceptor_.set_option(io::basic_socket::reuse_address,true);
				::unlink(path.c_str());
				acceptor_.bind(ep);
				acceptor_.listen(backlog);
			}